

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

void __thiscall ON_DimStyle::SetZeroSuppress(ON_DimStyle *this,suppress_zero s)

{
  bool bVar1;
  
  if (this->m_zero_suppress != s) {
    bVar1 = ZeroSuppressMatchesLengthDisplay(s,this->m_dimension_length_display);
    if (bVar1) {
      this->m_zero_suppress = s;
      Internal_ContentChange(this);
    }
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,ZeroSuppress);
  return;
}

Assistant:

void ON_DimStyle::SetZeroSuppress(ON_DimStyle::suppress_zero s)
{
  if (m_zero_suppress != s)
  {
    if (ON_DimStyle::ZeroSuppressMatchesLengthDisplay(s, DimensionLengthDisplay()))
    {
      m_zero_suppress = s;
      Internal_ContentChange();
    }
    //else
    //{
    //  ON_ERROR("Attempting to set zero suppression to a value that doesn't match length display.");
    //}
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::ZeroSuppress);
}